

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O1

void __thiscall
iu_FileSystemTest_x_iutest_x_FileSize64bit_Test::Body
          (iu_FileSystemTest_x_iutest_x_FileSize64bit_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ParamType *pPVar3;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  StdioFile file;
  uintmax_t expectedSize;
  allocator<char> local_249;
  AssertionResult local_248;
  IFile local_220;
  FILE *local_210;
  AssertionHelper local_208;
  string local_1d8;
  ParamType local_1b8;
  undefined1 local_1b0 [392];
  
  pPVar3 = iutest::WithParamInterface<unsigned_long>::GetParam();
  local_1b8 = *pPVar3;
  local_1b0._0_8_ = std::filesystem::file_size(&largefile_abi_cxx11_);
  iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (&local_248,(internal *)"expectedSize","::std::filesystem::file_size(largefile)",
             (char *)&local_1b8,(unsigned_long *)local_1b0,in_R9);
  if (local_248.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_248.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d8);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x67;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_message._M_dataplus._M_p == &local_248.m_message.field_2) {
      return;
    }
    operator_delete(local_248.m_message._M_dataplus._M_p,
                    CONCAT71(local_248.m_message.field_2._M_allocated_capacity._1_7_,
                             local_248.m_message.field_2._M_local_buf[0]) + 1);
    return;
  }
  paVar1 = &local_248.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_248.m_message._M_dataplus._M_p,
                    CONCAT71(local_248.m_message.field_2._M_allocated_capacity._1_7_,
                             local_248.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_220.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00186c28;
  local_220.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00186c78;
  local_210 = (FILE *)0x0;
  bVar2 = iutest::IFile::Open(&local_220,&largefile_abi_cxx11_,1);
  local_248.m_message._M_string_length = 0;
  local_248.m_message.field_2._M_local_buf[0] = '\0';
  local_248.m_message._M_dataplus._M_p = (pointer)paVar1;
  local_248.m_result = bVar2;
  if (!bVar2) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)&local_248,
               (AssertionResult *)"file.Open(largefile, iutest::IFile::OpenRead)","false","true",
               (char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_1d8._M_dataplus._M_p,&local_249);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x6a;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_248.m_message._M_dataplus._M_p,
                      CONCAT71(local_248.m_message.field_2._M_allocated_capacity._1_7_,
                               local_248.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar2) goto LAB_00149130;
  }
  local_1b0._0_8_ = iutest::StdioFile::GetSize((FILE *)local_210);
  iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (&local_248,(internal *)"expectedSize","file.GetSize()",(char *)&local_1b8,
             (unsigned_long *)local_1b0,in_R9);
  if (local_248.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_248.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d8);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x6c;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_248.m_message._M_dataplus._M_p,
                    CONCAT71(local_248.m_message.field_2._M_allocated_capacity._1_7_,
                             local_248.m_message.field_2._M_local_buf[0]) + 1);
  }
LAB_00149130:
  local_220.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00186c28;
  local_220.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00186c78;
  if (local_210 != (FILE *)0x0) {
    fclose(local_210);
  }
  return;
}

Assistant:

IUTEST_P(FileSystemTest, FileSize64bit)
{
    const uintmax_t expectedSize = GetParam();
    IUTEST_ASSUME_EQ(expectedSize, ::std::filesystem::file_size(largefile));

    ::iutest::StdioFile file;
    IUTEST_ASSERT_TRUE( file.Open(largefile, iutest::IFile::OpenRead) );
#if IUTEST_HAS_FILENO && IUTEST_HAS_FILE_STAT
    IUTEST_EXPECT_EQ(expectedSize, file.GetSize());
#else
    IUTEST_INFORM_EQ(expectedSize, file.GetSize());
#endif
}